

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriggerVariableTests.cpp
# Opt level: O0

void __thiscall
triggervariable_waitActivation_Test::TestBody(triggervariable_waitActivation_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_1f8;
  AssertHelper local_1d8;
  Message local_1d0;
  bool local_1c1;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar__2;
  duration<long,_std::ratio<1L,_1000L>_> local_1a8;
  string local_1a0;
  AssertHelper local_180;
  Message local_178;
  bool local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_138;
  Message local_130;
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_;
  undefined1 local_e8 [8];
  future<void> fut;
  undefined1 local_d0 [6];
  atomic<bool> completed;
  atomic<bool> started;
  TriggerVariable trigger;
  triggervariable_waitActivation_Test *this_local;
  
  gmlc::concurrency::TriggerVariable::TriggerVariable((TriggerVariable *)local_d0,false);
  fut.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = 0;
  fut.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._6_1_ = 0;
  std::async<triggervariable_waitActivation_Test::TestBody()::__0>((launch)local_e8,(type *)0x1);
  std::this_thread::yield();
  while (bVar1 = std::atomic<bool>::load
                           ((atomic<bool> *)
                            ((long)&fut.super___basic_future<void>._M_state.
                                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi + 7),memory_order_seq_cst),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    std::this_thread::yield();
  }
  local_121 = std::atomic<bool>::load
                        ((atomic<bool> *)
                         ((long)&fut.super___basic_future<void>._M_state.
                                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 7),memory_order_seq_cst);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_120,&local_121,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_120,
               (AssertionResult *)"started.load()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/TriggerVariableTests.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_169 = std::atomic<bool>::load
                        ((atomic<bool> *)
                         ((long)&fut.super___basic_future<void>._M_state.
                                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 6),memory_order_seq_cst);
  local_169 = !local_169;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_168,&local_169,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a0,(internal *)local_168,(AssertionResult *)"completed.load()","true","false"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/TriggerVariableTests.cpp"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  gmlc::concurrency::TriggerVariable::activate((TriggerVariable *)local_d0);
  std::this_thread::yield();
  bVar1 = std::atomic<bool>::load
                    ((atomic<bool> *)
                     ((long)&fut.super___basic_future<void>._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 6),memory_order_seq_cst);
  if (!bVar1) {
    gtest_ar__2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 100;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_1a8,
               (int *)((long)&gtest_ar__2.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 4));
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_1a8);
  }
  local_1c1 = std::atomic<bool>::load
                        ((atomic<bool> *)
                         ((long)&fut.super___basic_future<void>._M_state.
                                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 6),memory_order_seq_cst);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c0,&local_1c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1f8,(internal *)local_1c0,(AssertionResult *)"completed.load()","false","true"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/TriggerVariableTests.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  std::future<void>::~future((future<void> *)local_e8);
  gmlc::concurrency::TriggerVariable::~TriggerVariable((TriggerVariable *)local_d0);
  return;
}

Assistant:

TEST(triggervariable, waitActivation)
{
    TriggerVariable trigger;
    std::atomic<bool> started{false};
    std::atomic<bool> completed{false};
    auto fut = std::async(std::launch::async, [&]() {
        started = true;
        trigger.waitActivation();
        completed = true;
    });

    std::this_thread::yield();
    while (!started.load()) {
        std::this_thread::yield();
    }
    EXPECT_TRUE(started.load());
    EXPECT_FALSE(completed.load());
    trigger.activate();
    std::this_thread::yield();
    if (!completed.load()) {
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
    }
    EXPECT_TRUE(completed.load());
}